

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_resume(OpenJTalk *oj)

{
  long in_RDI;
  OpenJTalk *in_stack_00000030;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if ((((g_psd->finished & 1U) == 0) && ((g_psd->paused & 1U) != 0)) && (g_psd->length != 0)) {
    speak_async(in_stack_00000030);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_resume(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	if (g_psd->finished)
	{
		return;
	}

	if (!g_psd->paused)
	{
		return;
	}

	if (g_psd->length != 0)
	{
		speak_async(oj);
	}
}